

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O3

int __thiscall soplex::LPColSetBase<double>::remove(LPColSetBase<double> *this,char *__filename)

{
  int iVar1;
  pointer pdVar2;
  int *piVar3;
  int extraout_EAX;
  int iVar4;
  DataKey local_30;
  
  iVar4 = (int)__filename;
  local_30 = (this->super_SVSetBase<double>).set.thekey[iVar4];
  SVSetBase<double>::remove(&this->super_SVSetBase<double>,(char *)&local_30);
  iVar1 = (this->super_SVSetBase<double>).set.thenum;
  pdVar2 = (this->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[iVar4] = pdVar2[iVar1];
  pdVar2 = (this->up).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[iVar4] = pdVar2[iVar1];
  pdVar2 = (this->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[iVar4] = pdVar2[iVar1];
  piVar3 = (this->scaleExp).data;
  piVar3[iVar4] = piVar3[iVar1];
  VectorBase<double>::reDim(&this->low,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->up,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
  DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.thenum);
  return extraout_EAX;
}

Assistant:

void remove(int i)
   {
      SVSetBase<R>::remove(i);
      low[i] = low[num()];
      up[i] = up[num()];
      object[i] = object[num()];
      scaleExp[i] = scaleExp[num()];
      low.reDim(num());
      up.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }